

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  int *piVar1;
  cmCTest *this_00;
  cmCTestMemCheckHandler *pcVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  ostream *poVar7;
  pointer pbVar8;
  long lVar9;
  pointer pbVar10;
  _func_int **pp_Var11;
  ulong uVar12;
  pointer pbVar13;
  ulong uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  ostringstream cmCTestLog_msg;
  RegularExpression pfW;
  ostringstream ostr;
  char *local_460;
  long local_458;
  char local_450;
  undefined7 uStack_44f;
  cmCTestMemCheckHandler *local_440;
  ulong local_438;
  pointer local_430;
  pointer local_428;
  ulong local_420;
  string *local_418;
  vector<int,_std::allocator<int>_> *local_410;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_408;
  undefined1 local_3f0 [112];
  ios_base local_380 [264];
  RegularExpression local_278;
  undefined1 local_1a8 [376];
  
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410 = results;
  cmsys::SystemTools::Split(str,&local_408);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  uVar14 = 0;
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  local_278.regmust = (char *)0x0;
  local_278.program = (char *)0x0;
  local_278.progsize = 0;
  local_418 = log;
  memset(&local_278,0,0xaa);
  cmsys::RegularExpression::compile(&local_278,"^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");
  if (local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_408.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar14 = 0;
    local_430 = local_408.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = local_408.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar13 = local_408.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_440 = this;
    do {
      pbVar6 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar8 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar4 = cmsys::RegularExpression::find
                        (&local_278,(pbVar10->_M_dataplus)._M_p,&local_278.regmatch);
      local_438 = (long)pbVar6 - (long)pbVar8 >> 5;
      pbVar8 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->ResultStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar4) {
        if (pbVar6 == pbVar8) {
          uVar12 = 0;
          pbVar8 = pbVar6;
          uVar3 = local_438;
        }
        else {
          lVar9 = 8;
          uVar12 = 0;
          local_428 = pbVar10;
          local_420 = uVar14;
          do {
            if (local_278.regmatch.startp[1] == (char *)0x0) {
              pp_Var11 = (_func_int **)(local_3f0 + 0x10);
              local_3f0._8_8_ = 0;
              local_3f0[0x10] = 0;
              local_3f0._0_8_ = pp_Var11;
              if (*(long *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9) != 0) goto LAB_001cb2b6;
              bVar4 = true;
            }
            else {
              local_3f0._0_8_ = local_3f0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3f0,local_278.regmatch.startp[1],local_278.regmatch.endp[1]
                        );
              pp_Var11 = (_func_int **)local_3f0._0_8_;
              pbVar8 = (local_440->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (local_3f0._8_8_ == *(size_t *)((long)&(pbVar8->_M_dataplus)._M_p + lVar9)) {
                if (local_3f0._8_8_ == 0) {
                  bVar4 = true;
                }
                else {
                  iVar5 = bcmp((void *)local_3f0._0_8_,*(void **)((long)pbVar8 + lVar9 + -8),
                               local_3f0._8_8_);
                  bVar4 = iVar5 == 0;
                }
              }
              else {
LAB_001cb2b6:
                bVar4 = false;
                pp_Var11 = (_func_int **)local_3f0._0_8_;
              }
            }
            pcVar2 = local_440;
            if (pp_Var11 != (_func_int **)(local_3f0 + 0x10)) {
              operator_delete(pp_Var11,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
              pbVar8 = (pcVar2->ResultStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            pbVar6 = (pcVar2->ResultStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            this = local_440;
            pbVar10 = local_428;
            uVar14 = local_420;
            uVar3 = uVar12;
            if (bVar4) break;
            uVar12 = uVar12 + 1;
            lVar9 = lVar9 + 0x20;
            uVar3 = local_438;
          } while (uVar12 < (ulong)((long)pbVar6 - (long)pbVar8 >> 5));
        }
        local_438 = uVar3;
        pbVar13 = local_430;
        if (uVar12 == (long)pbVar6 - (long)pbVar8 >> 5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
          pbVar13 = local_430;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3f0,"Unknown Purify memory fault: ",0x1d);
          if (local_278.regmatch.startp[1] == (char *)0x0) {
            local_460 = &local_450;
            local_458 = 0;
            local_450 = '\0';
          }
          else {
            local_460 = &local_450;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_460,local_278.regmatch.startp[1],local_278.regmatch.endp[1])
            ;
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3f0,local_460,local_458);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_460 != &local_450) {
            operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
          }
          this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(this_00,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                       ,0x38a,local_460,false);
          if (local_460 != &local_450) {
            operator_delete(local_460,CONCAT71(uStack_44f,local_450) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
          std::ios_base::~ios_base(local_380);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"*** Unknown Purify memory fault: ",0x21);
          if (local_278.regmatch.startp[1] == (char *)0x0) {
            local_3f0._0_8_ = local_3f0 + 0x10;
            local_3f0._8_8_ = 0;
            local_3f0[0x10] = 0;
          }
          else {
            local_3f0._0_8_ = local_3f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f0,local_278.regmatch.startp[1],local_278.regmatch.endp[1]);
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3f0._0_8_,local_3f0._8_8_);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
            operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
          }
          pbVar8 = (this->ResultStrings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar6 = (this->ResultStrings).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      if (local_438 != (long)pbVar6 - (long)pbVar8 >> 5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<b>",3);
        uVar3 = local_438;
        pbVar6 = (this->ResultStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,pbVar6[local_438]._M_dataplus._M_p,
                            pbVar6[local_438]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"</b> ",5);
        piVar1 = (local_410->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start + uVar3;
        *piVar1 = *piVar1 + 1;
        uVar14 = (ulong)((int)uVar14 + 1);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length
                         );
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar13);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_418,(string *)local_3f0);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,CONCAT71(local_3f0._17_7_,local_3f0[0x10]) + 1);
  }
  this->DefectCount = this->DefectCount + (int)uVar14;
  if (local_278.program != (char *)0x0) {
    operator_delete__(local_278.program);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408);
  return (int)uVar14 == 0;
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckPurifyOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  std::ostringstream ostr;
  log.clear();

  cmsys::RegularExpression pfW("^\\[[WEI]\\] ([A-Z][A-Z][A-Z][A-Z]*): ");

  int defects = 0;

  for (std::string const& l : lines) {
    std::vector<int>::size_type failure = this->ResultStrings.size();
    if (pfW.find(l)) {
      std::vector<int>::size_type cc;
      for (cc = 0; cc < this->ResultStrings.size(); cc++) {
        if (pfW.match(1) == this->ResultStrings[cc]) {
          failure = cc;
          break;
        }
      }
      if (cc == this->ResultStrings.size()) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Unknown Purify memory fault: " << pfW.match(1)
                                                   << std::endl);
        ostr << "*** Unknown Purify memory fault: " << pfW.match(1)
             << std::endl;
      }
    }
    if (failure != this->ResultStrings.size()) {
      ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
      results[failure]++;
      defects++;
    }
    ostr << l << std::endl;
  }

  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}